

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

symbol * get_base_symbol_type(dmr_C *C,access_data *ad)

{
  char cVar1;
  int iVar2;
  linearizer_state_t *plVar3;
  linearizer_state_t **pplVar4;
  
  iVar2 = *(int *)((long)&C->target + 4);
  if (iVar2 == 1) {
    if (*(char *)&(C->L->pseudo_allocator).name_ != ')') {
      return (symbol *)0x0;
    }
    pplVar4 = (linearizer_state_t **)&(C->L->pseudo_allocator).total_bytes;
  }
  else {
    if (iVar2 != 2) {
      return (symbol *)0x0;
    }
    pplVar4 = &C->L;
  }
  plVar3 = *pplVar4;
  if (plVar3 == (linearizer_state_t *)0x0) {
    return (symbol *)0x0;
  }
  cVar1 = *(char *)&(plVar3->pseudo_allocator).name_;
  if (cVar1 == '\x03') {
    plVar3 = (linearizer_state_t *)(plVar3->asm_constraint_allocator).name_;
    cVar1 = *(char *)&(plVar3->pseudo_allocator).name_;
  }
  if (cVar1 == '\x04') {
    return (symbol *)(plVar3->asm_constraint_allocator).name_;
  }
  return (symbol *)plVar3;
}

Assistant:

static struct symbol *get_base_symbol_type(struct dmr_C *C, struct access_data *ad) {
        (void) C;
	struct symbol *orig_type = NULL;
	if (ad->address->type == PSEUDO_SYM) {
		orig_type = ad->address->sym;
	}
	else if (ad->address->type == PSEUDO_REG) {
		if (ad->address->def->opcode == OP_LOAD) {
			orig_type = ad->address->def->orig_type;
		}
	}
	if (orig_type) {
		if (orig_type->type == SYM_NODE)
			orig_type = orig_type->ctype.base_type;
		if (orig_type->type == SYM_PTR)
			orig_type = orig_type->ctype.base_type;
		//dmrC_show_type(C, orig_type);
	}
	return orig_type;
}